

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O2

FlowDecl * __thiscall AnalyzerFlow::flow_decl(AnalyzerFlow *this)

{
  FlowDecl *pFVar1;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (FLAGS_pac_debug) {
    fprintf(_stderr,"Getting flow_decl for %s\n",(this->type_id_->name)._M_dataplus._M_p);
  }
  pFVar1 = this->flow_decl_;
  if (pFVar1 == (FlowDecl *)0x0) {
    pFVar1 = (FlowDecl *)Decl::LookUpDecl((ID *)0x10f5e7);
    if ((pFVar1 == (FlowDecl *)0x0) ||
       ((pFVar1->super_AnalyzerDecl).super_TypeDecl.super_Decl.decl_type_ != FLOW)) {
      pFVar1 = this->flow_decl_;
      if (pFVar1 == (FlowDecl *)0x0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"cannot find the flow declaration",&local_39);
        Exception::Exception(this_00,&(this->super_AnalyzerElement).super_Object,&local_38);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      this->flow_decl_ = pFVar1;
    }
  }
  return pFVar1;
}

Assistant:

FlowDecl* AnalyzerFlow::flow_decl()
	{
	DEBUG_MSG("Getting flow_decl for %s\n", type_id_->Name());
	if ( ! flow_decl_ )
		{
		Decl* decl = Decl::LookUpDecl(type_id_);
		if ( decl && decl->decl_type() == Decl::FLOW )
			flow_decl_ = static_cast<FlowDecl*>(decl);
		if ( ! flow_decl_ )
			{
			throw Exception(this, "cannot find the flow declaration");
			}
		}
	return flow_decl_;
	}